

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deArrayBuffer.hpp
# Opt level: O2

ArrayBuffer<int,_4UL,_4UL> * __thiscall
de::ArrayBuffer<int,_4UL,_4UL>::operator=
          (ArrayBuffer<int,_4UL,_4UL> *this,ArrayBuffer<int,_4UL,_4UL> *other)

{
  void *pvVar1;
  size_t sVar2;
  ArrayBuffer<int,_4UL,_4UL> copied;
  ArrayBuffer<int,_4UL,_4UL> local_20;
  
  ArrayBuffer(&local_20,other);
  pvVar1 = this->m_ptr;
  sVar2 = this->m_cap;
  this->m_ptr = local_20.m_ptr;
  this->m_cap = local_20.m_cap;
  local_20.m_ptr = pvVar1;
  local_20.m_cap = sVar2;
  clear(&local_20);
  return this;
}

Assistant:

ArrayBuffer<T,Alignment,Stride>& ArrayBuffer<T,Alignment,Stride>::operator= (const ArrayBuffer& other)
{
	ArrayBuffer copied(other);
	swap(copied);
	return *this;
}